

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O1

int Sdm_ManComputeFunc(Sdm_Man_t *p,int iDsdLit0,int iDsdLit1,int *pCut,int uMask,int fXor)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  ulong t;
  ulong uVar11;
  uint uVar12;
  word wVar13;
  word *pwVar14;
  uint local_48 [8];
  
  p->nAllDsd = p->nAllDsd + 1;
  if (uMask < 2) {
    __assert_fail("uMask > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a1,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  if (0x4a5 < iDsdLit0) {
    __assert_fail("iDsdLit0 < DSD_CLASS_NUM * 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a2,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  if (0x4a5 < iDsdLit1) {
    __assert_fail("iDsdLit1 < DSD_CLASS_NUM * 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a3,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  if ((iDsdLit0 < 0) || (iDsdLit1 < 0)) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (p->vMap2Perm->nSize <= (int)(uMask & 0x3ffffU)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = ((uint)iDsdLit1 >> 1) * 0x2d0 + p->vMap2Perm->pArray[uMask & 0x3ffffU];
  if (((int)uVar2 < 0) || (p->vPerm6->nSize <= (int)uVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  wVar13 = p->vPerm6->pArray[uVar2];
  if (0x3ffff < (uint)uMask) {
    pwVar14 = s_Truths6;
    lVar5 = 0;
    do {
      if ((((uint)uMask >> 0x12) >> ((uint)lVar5 & 0x1f) & 1) != 0) {
        bVar7 = (byte)(1 << ((byte)lVar5 & 0x1f));
        wVar13 = (*pwVar14 & wVar13) >> (bVar7 & 0x3f) | wVar13 << (bVar7 & 0x3f) & *pwVar14;
      }
      lVar5 = lVar5 + 1;
      pwVar14 = pwVar14 + 1;
    } while (lVar5 != 6);
  }
  uVar11 = p->pDsd6[(uint)iDsdLit0 >> 1].uTruth ^ (long)(int)-(iDsdLit0 & 1U);
  uVar10 = (long)(int)-(iDsdLit1 & 1U) ^ wVar13;
  t = uVar10 & uVar11;
  if (fXor != 0) {
    t = uVar10 ^ uVar11;
  }
  uVar2 = Sdm_ManCheckDsd6(p,t);
  if (uVar2 == 0xffffffff) {
    piVar8 = &p->nNonDsd;
    iVar4 = -1;
  }
  else {
    uVar12 = (int)uVar2 >> 0x11;
    if ((int)uVar12 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    uVar3 = uVar2 & 0xffff;
    if (0xb3ff < uVar3) {
      __assert_fail("(Config >> 6) < 720",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                    ,0x3c8,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
    }
    if (pCut != (int *)0x0) {
      local_48[0] = 0xffffffff;
      local_48[1] = 0xffffffff;
      local_48[2] = 0xffffffff;
      local_48[3] = 0xffffffff;
      local_48[4] = 0xffffffff;
      local_48[5] = 0xffffffff;
      iVar4 = *pCut;
      if (6 < (long)iVar4) {
        __assert_fail("pCut[0] <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                      ,0x3cc,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
      }
      if (0 < iVar4) {
        lVar5 = 0;
        do {
          lVar6 = lVar5 + 1;
          if (pCut[lVar6] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar9 = (uint)lVar5;
          pcVar1 = p->Perm6[uVar3 >> 6] + lVar5;
          lVar5 = lVar5 + 1;
          local_48[*pcVar1] = pCut[lVar6] ^ (uint)((uVar3 >> (uVar9 & 0x1f) & 1) != 0);
        } while (iVar4 != lVar5);
      }
      iVar4 = p->pDsd6[uVar12].nVars;
      lVar5 = (long)iVar4;
      *pCut = iVar4;
      if (0 < lVar5) {
        lVar6 = 0;
        do {
          if (local_48[lVar6] == 0xffffffff) {
            __assert_fail("pLeavesNew[i] != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                          ,0x3d1,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      if (0 < iVar4) {
        memcpy(pCut + 1,local_48,lVar5 << 2);
      }
    }
    if (0x252 < (int)uVar12) {
      __assert_fail("iClass < DSD_CLASS_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                    ,0x3d5,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
    }
    iVar4 = (uVar2 >> 0x10 & 1) + uVar12 * 2;
    piVar8 = p->nCountDsd + uVar12;
  }
  *piVar8 = *piVar8 + 1;
  return iVar4;
}

Assistant:

int Sdm_ManComputeFunc( Sdm_Man_t * p, int iDsdLit0, int iDsdLit1, int * pCut, int uMask, int fXor )
{
//    int fVerbose = 0;
    int i, Config, iClass, fCompl, Res;
    int PermMask = uMask & 0x3FFFF;
    int ComplMask = uMask >> 18;
    word Truth0, Truth1p, t0, t1, t;
    p->nAllDsd++;

    assert( uMask > 1 );
    assert( iDsdLit0 < DSD_CLASS_NUM * 2 );
    assert( iDsdLit1 < DSD_CLASS_NUM * 2 );
    Truth0  = p->pDsd6[Abc_Lit2Var(iDsdLit0)].uTruth;
    Truth1p = Vec_WrdEntry( p->vPerm6, Abc_Lit2Var(iDsdLit1) * 720 + Vec_IntEntry(p->vMap2Perm, PermMask ) );
    if ( ComplMask )
        for ( i = 0; i < 6; i++ )
            if ( (ComplMask >> i) & 1 )
                Truth1p = Abc_Tt6Flip( Truth1p, i );            
    t0 = Abc_LitIsCompl(iDsdLit0) ? ~Truth0  : Truth0;
    t1 = Abc_LitIsCompl(iDsdLit1) ? ~Truth1p : Truth1p;
    t = fXor ? t0 ^ t1 : t0 & t1;
/*
if ( fVerbose )
{
Sdm_ManPrintPerm( PermMask );                      printf( "\n" );
Extra_PrintBinary( stdout, &ComplMask, 6 );        printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth0, 6 );   printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth1p, 6 );  printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );        printf( "\n" );
}
*/
    // find configuration
    Config = Sdm_ManCheckDsd6( p, t );
    if ( Config == -1 )
    {
        p->nNonDsd++;
        return -1;
    }

    // get the class
    iClass = Config >> 17;
    fCompl = (Config >> 16) & 1;
    Config &= 0xFFFF;

    // set the function
    Res = Abc_Var2Lit( iClass, fCompl );

    // update cut
    assert( (Config >> 6) < 720 );
    if ( pCut )
    {
        int pLeavesNew[6] = { -1, -1, -1, -1, -1, -1 };
        assert( pCut[0] <= 6 );
        for ( i = 0; i < pCut[0]; i++ )
            pLeavesNew[(int)(p->Perm6[Config >> 6][i])] = Abc_LitNotCond( pCut[i+1], (Config >> i) & 1 );
        pCut[0] = p->pDsd6[iClass].nVars;
        for ( i = 0; i < pCut[0]; i++ )
            assert( pLeavesNew[i] != -1 );
        for ( i = 0; i < pCut[0]; i++ )
            pCut[i+1] = pLeavesNew[i];
    }
    assert( iClass < DSD_CLASS_NUM );
    p->nCountDsd[iClass]++;
    return Res;
}